

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int buffer_encrypt_record(ptls_buffer_t *buf,size_t rec_start,ptls_aead_context_t *aead)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  size_t enclen;
  uint8_t encrypted [16640];
  size_t local_4120;
  undefined1 local_4118 [16640];
  
  sVar5 = (buf->off - rec_start) - 5;
  if (sVar5 < 0x4001) {
    iVar4 = ptls_aead_transform(aead,local_4118,&local_4120,buf->base + rec_start + 5,sVar5,
                                buf->base[rec_start]);
    if (iVar4 == 0) {
      buf->off = rec_start;
      iVar4 = ptls_buffer_reserve(buf,3);
      sVar5 = local_4120;
      if (iVar4 == 0) {
        puVar2 = buf->base;
        sVar3 = buf->off;
        puVar1 = puVar2 + sVar3;
        puVar1[0] = '\x17';
        puVar1[1] = '\x03';
        puVar2[sVar3 + 2] = '\x01';
        buf->off = buf->off + 3;
        iVar4 = 0;
      }
      if (iVar4 == 0) {
        iVar4 = ptls_buffer_reserve(buf,2);
        if (iVar4 == 0) {
          *(ushort *)(buf->base + buf->off) = (ushort)sVar5 << 8 | (ushort)sVar5 >> 8;
          buf->off = buf->off + 2;
          iVar4 = 0;
        }
        if (((iVar4 == 0) && (iVar4 = 0, local_4120 != 0)) &&
           (iVar4 = ptls_buffer_reserve(buf,local_4120), iVar4 == 0)) {
          memcpy(buf->base + buf->off,local_4118,local_4120);
          buf->off = buf->off + local_4120;
          iVar4 = 0;
        }
      }
    }
    return iVar4;
  }
  __assert_fail("bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/picotls.c"
                ,0x15b,"int buffer_encrypt_record(ptls_buffer_t *, size_t, ptls_aead_context_t *)");
}

Assistant:

static int buffer_encrypt_record(ptls_buffer_t *buf, size_t rec_start, ptls_aead_context_t *aead)
{
    uint8_t encrypted[PTLS_MAX_ENCRYPTED_RECORD_SIZE];
    size_t enclen, bodylen = buf->off - rec_start - 5;
    int ret;

    assert(bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE);

    if ((ret = ptls_aead_transform(aead, encrypted, &enclen, buf->base + rec_start + 5, bodylen, buf->base[rec_start])) != 0)
        goto Exit;
    buf->off = rec_start;
    ptls_buffer_push(buf, PTLS_CONTENT_TYPE_APPDATA, 3, 1);
    ptls_buffer_push16(buf, enclen);
    ptls_buffer_pushv(buf, encrypted, enclen);

Exit:
    return ret;
}